

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSatOld.c
# Opt level: O3

int Cbs0_ManPropagate(Cbs0_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  Gia_Obj_t **ppGVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  size_t __size;
  Gia_Obj_t *pGVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  
  do {
    iVar13 = (p->pProp).iHead;
    lVar14 = (long)iVar13;
    uVar8 = (p->pProp).iTail;
    uVar6 = (ulong)uVar8;
    if (iVar13 < (int)uVar8) {
      do {
        uVar8 = (uint)uVar6;
        pGVar9 = (p->pProp).pData[lVar14];
        if (pGVar9 == (Gia_Obj_t *)0x0) break;
        if (((ulong)pGVar9 & 1) != 0) {
          __assert_fail("!Gia_IsComplement(pVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSatOld.c"
                        ,0x1d4,"int Cbs0_ManPropagateOne(Cbs0_Man_t *, Gia_Obj_t *)");
        }
        uVar6 = *(ulong *)pGVar9;
        uVar8 = (uint)uVar6;
        if ((uVar8 >> 0x1e & 1) == 0) {
          __assert_fail("Cbs0_VarIsAssigned(pVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSatOld.c"
                        ,0x1d5,"int Cbs0_ManPropagateOne(Cbs0_Man_t *, Gia_Obj_t *)");
        }
        if ((~uVar8 & 0x9fffffff) != 0) {
          if (((int)uVar8 < 0) || (uVar2 = uVar8 & 0x1fffffff, uVar2 == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSatOld.c"
                          ,0x1d8,"int Cbs0_ManPropagateOne(Cbs0_Man_t *, Gia_Obj_t *)");
          }
          uVar7 = ((uint)(uVar6 >> 0x1d) & 7 ^
                  (uint)((ulong)*(undefined8 *)(pGVar9 + -(ulong)uVar2) >> 0x3e)) & 1;
          uVar3 = (uint)*(undefined8 *)(pGVar9 + -(ulong)uVar2);
          if ((uVar3 >> 0x1e & 1) == 0) {
            uVar7 = 2;
          }
          uVar10 = (uint)(uVar6 >> 0x20);
          uVar11 = (uint)*(undefined8 *)(pGVar9 + -(ulong)(uVar10 & 0x1fffffff));
          uVar10 = (uVar10 >> 0x1d ^
                   (uint)((ulong)*(undefined8 *)(pGVar9 + -(ulong)(uVar10 & 0x1fffffff)) >> 0x3e)) &
                   1;
          if ((uVar11 >> 0x1e & 1) == 0) {
            uVar10 = 2;
          }
          if ((uVar8 >> 0x1e & 1) == 0) goto LAB_006697e9;
          if ((uVar6 & 0x4000000000000000) == 0) {
            if (uVar10 != 0 && uVar7 != 0) {
              if ((uVar7 == 1) && (uVar10 == 1)) {
                return 1;
              }
              if ((uVar7 == 1) || (uVar10 == 1)) {
                if ((uVar3 >> 0x1e & 1) == 0) {
                  Cbs0_ManAssign(p,(Gia_Obj_t *)
                                   (((ulong)(uVar8 >> 0x1d & 1) | (ulong)(pGVar9 + -(ulong)uVar2)) ^
                                   1));
                }
                if ((uVar11 >> 0x1e & 1) == 0) {
                  uVar8 = (uint)(*(ulong *)pGVar9 >> 0x20);
                  pGVar9 = (Gia_Obj_t *)
                           (((ulong)(uVar8 >> 0x1d & 1) |
                            (ulong)(pGVar9 + -(ulong)(uVar8 & 0x1fffffff))) ^ 1);
                  goto LAB_00669589;
                }
              }
              else {
                if (((uVar3 | uVar11) >> 0x1e & 1) != 0) {
                  __assert_fail("Cbs0_VarIsJust(pVar)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSatOld.c"
                                ,0x1f2,"int Cbs0_ManPropagateOne(Cbs0_Man_t *, Gia_Obj_t *)");
                }
                iVar13 = (p->pJust).iHead;
                lVar4 = (long)iVar13;
                iVar12 = (p->pJust).iTail;
                if (iVar13 < iVar12) {
                  do {
                    pGVar1 = (p->pJust).pData[lVar4];
                    if (pGVar1 == (Gia_Obj_t *)0x0) break;
                    if (pGVar1 == pGVar9) {
                      __assert_fail("!Cbs0_QueHasNode( &p->pJust, pVar )",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSatOld.c"
                                    ,499,"int Cbs0_ManPropagateOne(Cbs0_Man_t *, Gia_Obj_t *)");
                    }
                    lVar4 = lVar4 + 1;
                  } while (iVar12 != lVar4);
                }
                if (iVar12 == (p->pJust).nSize) {
                  (p->pJust).nSize = iVar12 * 2;
                  ppGVar5 = (p->pJust).pData;
                  __size = (long)iVar12 << 4;
                  if (ppGVar5 == (Gia_Obj_t **)0x0) {
                    ppGVar5 = (Gia_Obj_t **)malloc(__size);
                  }
                  else {
                    ppGVar5 = (Gia_Obj_t **)realloc(ppGVar5,__size);
                    iVar12 = (p->pJust).iTail;
                  }
                  (p->pJust).pData = ppGVar5;
                }
                else {
                  ppGVar5 = (p->pJust).pData;
                }
                (p->pJust).iTail = iVar12 + 1;
                ppGVar5[iVar12] = pGVar9;
              }
            }
          }
          else {
            if (uVar10 == 0 || uVar7 == 0) {
              return 1;
            }
            if ((uVar3 >> 0x1e & 1) == 0) {
              Cbs0_ManAssign(p,(Gia_Obj_t *)
                               ((ulong)(uVar8 >> 0x1d & 1) | (ulong)(pGVar9 + -(ulong)uVar2)));
            }
            if ((uVar11 >> 0x1e & 1) == 0) {
              uVar8 = (uint)(*(ulong *)pGVar9 >> 0x20);
              pGVar9 = (Gia_Obj_t *)
                       ((ulong)(uVar8 >> 0x1d & 1) | (ulong)(pGVar9 + -(ulong)(uVar8 & 0x1fffffff)))
              ;
LAB_00669589:
              Cbs0_ManAssign(p,pGVar9);
            }
          }
        }
        lVar14 = lVar14 + 1;
        uVar8 = (p->pProp).iTail;
        uVar6 = (ulong)(int)uVar8;
      } while (lVar14 < (long)uVar6);
    }
    (p->pProp).iHead = uVar8;
    iVar13 = (p->pJust).iHead;
    iVar12 = (p->pJust).iTail;
    if (iVar13 < iVar12) {
      lVar14 = (long)iVar13;
      ppGVar5 = (p->pJust).pData;
      pGVar9 = ppGVar5[lVar14];
      while (pGVar9 != (Gia_Obj_t *)0x0) {
        lVar14 = lVar14 + 1;
        uVar6 = *(ulong *)pGVar9;
        uVar8 = (uint)uVar6;
        if (((int)uVar8 < 0) || (uVar2 = uVar8 & 0x1fffffff, uVar2 == 0x1fffffff)) {
          if (((ulong)pGVar9 & 1) == 0) {
            __assert_fail("Gia_ObjIsAnd(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSatOld.c"
                          ,0x207,"int Cbs0_ManPropagateTwo(Cbs0_Man_t *, Gia_Obj_t *)");
          }
LAB_0066986b:
          __assert_fail("!Gia_IsComplement(pVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSatOld.c"
                        ,0x206,"int Cbs0_ManPropagateTwo(Cbs0_Man_t *, Gia_Obj_t *)");
        }
        uVar3 = (uint)*(undefined8 *)(pGVar9 + -(ulong)uVar2);
        uVar7 = (uint)(uVar6 >> 0x20);
        if (((uVar3 >> 0x1e & 1) == 0) &&
           ((pGVar9[-(ulong)(uVar7 & 0x1fffffff)].field_0x3 & 0x40) == 0)) {
          lVar4 = (long)iVar13;
          iVar13 = iVar13 + 1;
          ppGVar5[lVar4] = pGVar9;
        }
        else {
          if (((ulong)pGVar9 & 1) != 0) goto LAB_0066986b;
          if (uVar8 < 0x40000000) {
            __assert_fail("Cbs0_VarIsAssigned(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSatOld.c"
                          ,0x208,"int Cbs0_ManPropagateTwo(Cbs0_Man_t *, Gia_Obj_t *)");
          }
          if ((uVar8 >> 0x1e & 1) == 0) {
LAB_006697e9:
            __assert_fail("pVar->fMark0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSatOld.c"
                          ,0x55,"int Cbs0_VarValue(Gia_Obj_t *)");
          }
          if ((uVar6 & 0x4000000000000000) != 0) {
            __assert_fail("!Cbs0_VarValue(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSatOld.c"
                          ,0x209,"int Cbs0_ManPropagateTwo(Cbs0_Man_t *, Gia_Obj_t *)");
          }
          uVar8 = ((uint)(uVar6 >> 0x1d) & 7 ^
                  (uint)((ulong)*(undefined8 *)(pGVar9 + -(ulong)uVar2) >> 0x3e)) & 1;
          if ((uVar3 >> 0x1e & 1) == 0) {
            uVar8 = 2;
          }
          uVar10 = (uint)*(undefined8 *)(pGVar9 + -(ulong)(uVar7 & 0x1fffffff));
          uVar7 = (uVar7 >> 0x1d ^
                  (uint)((ulong)*(undefined8 *)(pGVar9 + -(ulong)(uVar7 & 0x1fffffff)) >> 0x3e)) & 1
          ;
          if ((uVar10 >> 0x1e & 1) == 0) {
            uVar7 = 2;
          }
          if ((uVar8 != 0) && (uVar7 != 0)) {
            if ((uVar8 == 1) && (uVar7 == 1)) {
              return 1;
            }
            if ((uVar8 != 1) && (uVar7 != 1)) {
              __assert_fail("Value0 == 1 || Value1 == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSatOld.c"
                            ,0x211,"int Cbs0_ManPropagateTwo(Cbs0_Man_t *, Gia_Obj_t *)");
            }
            if ((uVar3 >> 0x1e & 1) == 0) {
              Cbs0_ManAssign(p,(Gia_Obj_t *)
                               (((ulong)((uint)(uVar6 >> 0x1d) & 1) |
                                (ulong)(pGVar9 + -(ulong)uVar2)) ^ 1));
            }
            if ((uVar10 >> 0x1e & 1) == 0) {
              uVar8 = (uint)(*(ulong *)pGVar9 >> 0x20);
              Cbs0_ManAssign(p,(Gia_Obj_t *)
                               (((ulong)(uVar8 >> 0x1d & 1) |
                                (ulong)(pGVar9 + -(ulong)(uVar8 & 0x1fffffff))) ^ 1));
            }
          }
        }
        iVar12 = (p->pJust).iTail;
        if (iVar12 <= lVar14) break;
        ppGVar5 = (p->pJust).pData;
        pGVar9 = ppGVar5[lVar14];
      }
    }
    if (iVar13 == iVar12) {
      return 0;
    }
    (p->pJust).iTail = iVar13;
  } while( true );
}

Assistant:

int Cbs0_ManPropagate( Cbs0_Man_t * p )
{
    Gia_Obj_t * pVar;
    int i, k;
    while ( 1 )
    {
        Cbs0_QueForEachEntry( p->pProp, pVar, i )
        {
            if ( Cbs0_ManPropagateOne( p, pVar ) )
                return 1;
        }
        p->pProp.iHead = p->pProp.iTail;
        k = p->pJust.iHead;
        Cbs0_QueForEachEntry( p->pJust, pVar, i )
        {
            if ( Cbs0_VarIsJust( pVar ) )
                p->pJust.pData[k++] = pVar;
            else if ( Cbs0_ManPropagateTwo( p, pVar ) )
                return 1;
        }
        if ( k == p->pJust.iTail )
            break;
        p->pJust.iTail = k;
    }
    return 0;
}